

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Reader::readValue(Reader *this)

{
  ulong uVar1;
  Value *pVVar2;
  long in_RDI;
  Token *in_stack_00000090;
  Reader *in_stack_00000098;
  size_t lastNonNewline;
  bool successful;
  Token token;
  Value *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  CommentPlacement in_stack_fffffffffffffeb4;
  string *in_stack_fffffffffffffeb8;
  ValueType type;
  allocator *paVar3;
  Value *in_stack_fffffffffffffec0;
  allocator local_109;
  string local_108 [16];
  Location in_stack_ffffffffffffff08;
  Token *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  Reader *in_stack_ffffffffffffff20;
  Token *in_stack_ffffffffffffff30;
  Reader *in_stack_ffffffffffffff38;
  Token *in_stack_ffffffffffffff80;
  Reader *in_stack_ffffffffffffff88;
  Value local_60;
  long local_38;
  byte local_29;
  int local_28;
  long local_20;
  long local_18;
  byte local_1;
  
  skipCommentTokens((Reader *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                    (Token *)in_stack_fffffffffffffea8);
  local_29 = 1;
  if (((*(byte *)(in_RDI + 0x10c) & 1) != 0) &&
     (uVar1 = std::__cxx11::string::empty(), (uVar1 & 1) == 0)) {
    local_38 = std::__cxx11::string::find_last_not_of((char *)(in_RDI + 0xe8),0x14a6c6);
    if (local_38 == -1) {
      std::__cxx11::string::clear();
    }
    else {
      std::__cxx11::string::erase(in_RDI + 0xe8,local_38 + 1);
    }
    currentValue((Reader *)0x12678f);
    Value::setComment(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4)
    ;
    std::__cxx11::string::operator=((string *)(in_RDI + 0xe8),"");
  }
  pVVar2 = (Value *)(ulong)(local_28 - 1);
  type = (ValueType)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  switch(pVVar2) {
  case (Value *)0x0:
    local_29 = readObject(in_stack_00000098,in_stack_00000090);
    pVVar2 = currentValue((Reader *)0x126810);
    Value::setOffsetLimit(pVVar2,*(long *)(in_RDI + 0xd0) - *(long *)(in_RDI + 0xc0));
    break;
  default:
switchD_001267e9_caseD_1:
    pVVar2 = currentValue((Reader *)0x126be0);
    Value::setOffsetStart(pVVar2,local_20 - *(long *)(in_RDI + 0xc0));
    pVVar2 = currentValue((Reader *)0x126c09);
    Value::setOffsetLimit(pVVar2,local_18 - *(long *)(in_RDI + 0xc0));
    paVar3 = &local_109;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"Syntax error: value, object or array expected.",paVar3);
    local_1 = addError(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10
                       ,in_stack_ffffffffffffff08);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    goto LAB_00126d1b;
  case (Value *)0x2:
    local_29 = readArray(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    pVVar2 = currentValue((Reader *)0x126858);
    Value::setOffsetLimit(pVVar2,*(long *)(in_RDI + 0xd0) - *(long *)(in_RDI + 0xc0));
    break;
  case (Value *)0x4:
    local_29 = decodeString(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    break;
  case (Value *)0x5:
    local_29 = decodeNumber(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    break;
  case (Value *)0x6:
    Value::Value(&local_60,true);
    currentValue((Reader *)0x1268d7);
    Value::operator=((Value *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     in_stack_fffffffffffffea8);
    Value::~Value(pVVar2);
    pVVar2 = currentValue((Reader *)0x126909);
    Value::setOffsetStart(pVVar2,local_20 - *(long *)(in_RDI + 0xc0));
    pVVar2 = currentValue((Reader *)0x126932);
    Value::setOffsetLimit(pVVar2,local_18 - *(long *)(in_RDI + 0xc0));
    break;
  case (Value *)0x7:
    Value::Value((Value *)&stack0xffffffffffffff68,false);
    currentValue((Reader *)0x126995);
    Value::operator=((Value *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     in_stack_fffffffffffffea8);
    Value::~Value(pVVar2);
    pVVar2 = currentValue((Reader *)0x1269c7);
    Value::setOffsetStart(pVVar2,local_20 - *(long *)(in_RDI + 0xc0));
    pVVar2 = currentValue((Reader *)0x1269f0);
    Value::setOffsetLimit(pVVar2,local_18 - *(long *)(in_RDI + 0xc0));
    break;
  case (Value *)0x8:
    Value::Value(in_stack_fffffffffffffec0,type);
    currentValue((Reader *)0x126a53);
    Value::operator=((Value *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     in_stack_fffffffffffffea8);
    Value::~Value(pVVar2);
    pVVar2 = currentValue((Reader *)0x126a85);
    Value::setOffsetStart(pVVar2,local_20 - *(long *)(in_RDI + 0xc0));
    pVVar2 = currentValue((Reader *)0x126aae);
    Value::setOffsetLimit(pVVar2,local_18 - *(long *)(in_RDI + 0xc0));
    break;
  case (Value *)0x9:
    if ((*(byte *)(in_RDI + 0x10a) & 1) == 0) goto switchD_001267e9_caseD_1;
    *(long *)(in_RDI + 0xd0) = *(long *)(in_RDI + 0xd0) + -1;
    Value::Value(in_stack_fffffffffffffec0,type);
    currentValue((Reader *)0x126b36);
    Value::operator=((Value *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     in_stack_fffffffffffffea8);
    Value::~Value(pVVar2);
    pVVar2 = currentValue((Reader *)0x126b62);
    Value::setOffsetStart(pVVar2,(*(long *)(in_RDI + 0xd0) - *(long *)(in_RDI + 0xc0)) - 1);
    pVVar2 = currentValue((Reader *)0x126b8e);
    Value::setOffsetLimit(pVVar2,*(long *)(in_RDI + 0xd0) - *(long *)(in_RDI + 0xc0));
  }
  if ((*(byte *)(in_RDI + 0x10c) & 1) != 0) {
    *(undefined8 *)(in_RDI + 0xd8) = *(undefined8 *)(in_RDI + 0xd0);
    pVVar2 = currentValue((Reader *)0x126cfc);
    *(Value **)(in_RDI + 0xe0) = pVVar2;
  }
  local_1 = local_29 & 1;
LAB_00126d1b:
  return (bool)(local_1 & 1);
}

Assistant:

bool Reader::readValue() {
  Token token;
  skipCommentTokens(token);
  bool successful = true;

  if (collectComments_ && !commentsBefore_.empty()) {
    // Remove newline characters at the end of the comments
    size_t lastNonNewline = commentsBefore_.find_last_not_of("\r\n");
    if (lastNonNewline != std::string::npos) {
      commentsBefore_.erase(lastNonNewline + 1);
    } else {
      commentsBefore_.clear();
    }

    currentValue().setComment(commentsBefore_, commentBefore);
    commentsBefore_ = "";
  }

  switch (token.type_) {
  case tokenObjectBegin:
    successful = readObject(token);
    currentValue().setOffsetLimit(current_ - begin_);
    break;
  case tokenArrayBegin:
    successful = readArray(token);
    currentValue().setOffsetLimit(current_ - begin_);
    break;
  case tokenNumber:
    successful = decodeNumber(token);
    break;
  case tokenString:
    successful = decodeString(token);
    break;
  case tokenTrue:
    currentValue() = true;
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    break;
  case tokenFalse:
    currentValue() = false;
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    break;
  case tokenNull:
    currentValue() = Value();
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    break;
  case tokenArraySeparator:
    if (features_.allowDroppedNullPlaceholders_) {
      // "Un-read" the current token and mark the current value as a null
      // token.
      current_--;
      currentValue() = Value();
      currentValue().setOffsetStart(current_ - begin_ - 1);
      currentValue().setOffsetLimit(current_ - begin_);
      break;
    }
  // Else, fall through...
  default:
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    return addError("Syntax error: value, object or array expected.", token);
  }

  if (collectComments_) {
    lastValueEnd_ = current_;
    lastValue_ = &currentValue();
  }

  return successful;
}